

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fairness_test.cpp
# Opt level: O0

void __thiscall
FairMutexTest_FifoSched_Test<yamc::fair::basic_shared_mutex<yamc::rwlock::TaskFairness>_>::
FairMutexTest_FifoSched_Test
          (FairMutexTest_FifoSched_Test<yamc::fair::basic_shared_mutex<yamc::rwlock::TaskFairness>_>
           *this)

{
  FairMutexTest_FifoSched_Test<yamc::fair::basic_shared_mutex<yamc::rwlock::TaskFairness>_>
  *this_local;
  
  FairMutexTest<yamc::fair::basic_shared_mutex<yamc::rwlock::TaskFairness>_>::FairMutexTest
            (&this->super_FairMutexTest<yamc::fair::basic_shared_mutex<yamc::rwlock::TaskFairness>_>
            );
  (this->super_FairMutexTest<yamc::fair::basic_shared_mutex<yamc::rwlock::TaskFairness>_>).
  super_Test._vptr_Test = (_func_int **)&PTR__FairMutexTest_FifoSched_Test_002a2e70;
  return;
}

Assistant:

TYPED_TEST(FairMutexTest, FifoSched)
{
  SETUP_STEPTEST;
  yamc::test::phaser phaser(3);
  TypeParam mtx;
  yamc::test::stopwatch<> sw;
  yamc::test::task_runner(3, [&](std::size_t id) {
    auto ph = phaser.get(id);
    switch (id) {
    case 0:
      EXPECT_TRUE(mtx.try_lock());
      EXPECT_STEP(1);
      ph.advance(2);  // p1-2
      ph.await();     // p3
      EXPECT_STEP(4);
      mtx.unlock();
      mtx.lock();
      EXPECT_STEP(7);
      mtx.unlock();
      break;
    case 1:
      ph.await();     // p1
      EXPECT_STEP(2);
      ph.advance(2);  // p2-3
      mtx.lock();
      EXPECT_STEP(5);
      mtx.unlock();
      break;
    case 2:
      ph.await();     // p1
      EXPECT_FALSE(mtx.try_lock());
      ph.await();     // p2
      EXPECT_STEP(3);
      ph.advance(1);  // p3
      mtx.lock();
      EXPECT_STEP(6);
      mtx.unlock();
      break;
    }
  });
  EXPECT_LE(TEST_TICKS * 7, sw.elapsed());
}